

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O1

void __thiscall glu::VarTokenizer::advance(VarTokenizer *this)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  Token TVar5;
  TestError *this_00;
  int iVar6;
  int iVar7;
  
  iVar6 = this->m_tokenLen;
  iVar3 = this->m_tokenStart;
  iVar7 = iVar3 + iVar6;
  this->m_tokenStart = iVar7;
  this->m_token = TOKEN_LAST;
  this->m_tokenLen = 1;
  pcVar4 = this->m_str;
  bVar1 = pcVar4[iVar7];
  if (bVar1 < 0x5b) {
    if (bVar1 == 0) {
      TVar5 = TOKEN_END;
    }
    else {
      if (bVar1 != 0x2e) {
LAB_0085d2af:
        if ((byte)(bVar1 - 0x30) < 10) {
          this->m_token = TOKEN_NUMBER;
          iVar6 = this->m_tokenLen;
          cVar2 = pcVar4[iVar6 + iVar7];
          while ((byte)(cVar2 - 0x30U) < 10) {
            iVar6 = iVar6 + 1;
            this->m_tokenLen = iVar6;
            cVar2 = pcVar4[iVar7 + iVar6];
          }
          return;
        }
        if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unexpected character",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x50);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        this->m_token = TOKEN_IDENTIFIER;
        iVar7 = this->m_tokenLen;
        iVar6 = iVar3 + iVar7 + iVar6;
        while( true ) {
          iVar7 = iVar7 + 1;
          bVar1 = pcVar4[iVar6];
          if ((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) && (bVar1 != 0x5f && 9 < (byte)(bVar1 - 0x30)))
          break;
          this->m_tokenLen = iVar7;
          iVar6 = iVar6 + 1;
        }
        return;
      }
      TVar5 = TOKEN_PERIOD;
    }
  }
  else if (bVar1 == 0x5b) {
    TVar5 = TOKEN_LEFT_BRACKET;
  }
  else {
    if (bVar1 != 0x5d) goto LAB_0085d2af;
    TVar5 = TOKEN_RIGHT_BRACKET;
  }
  this->m_token = TVar5;
  return;
}

Assistant:

void VarTokenizer::advance (void)
{
	DE_ASSERT(m_token != TOKEN_END);

	m_tokenStart	+= m_tokenLen;
	m_token			 = TOKEN_LAST;
	m_tokenLen		 = 1;

	if (m_str[m_tokenStart] == '[')
		m_token = TOKEN_LEFT_BRACKET;
	else if (m_str[m_tokenStart] == ']')
		m_token = TOKEN_RIGHT_BRACKET;
	else if (m_str[m_tokenStart] == 0)
		m_token = TOKEN_END;
	else if (m_str[m_tokenStart] == '.')
		m_token = TOKEN_PERIOD;
	else if (isNum(m_str[m_tokenStart]))
	{
		m_token = TOKEN_NUMBER;
		while (isNum(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else if (isIdentifierChar(m_str[m_tokenStart]))
	{
		m_token = TOKEN_IDENTIFIER;
		while (isIdentifierChar(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else
		TCU_FAIL("Unexpected character");
}